

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdio.cpp
# Opt level: O0

SQRESULT sqstd_getfile(HSQUIRRELVM v,SQInteger idx,SQFILE *file)

{
  SQRESULT SVar1;
  _func_int **pp_Var2;
  SQFile *local_30;
  SQFile *fileobj;
  SQFILE *file_local;
  SQInteger idx_local;
  HSQUIRRELVM v_local;
  
  local_30 = (SQFile *)0x0;
  fileobj = (SQFile *)file;
  file_local = (SQFILE *)idx;
  idx_local = (SQInteger)v;
  SVar1 = sq_getinstanceup(v,idx,&local_30,&DAT_80000001);
  if (SVar1 < 0) {
    v_local = (HSQUIRRELVM)sq_throwerror((HSQUIRRELVM)idx_local,"not a file");
  }
  else {
    pp_Var2 = (_func_int **)SQFile::GetHandle(local_30);
    (fileobj->super_SQStream)._vptr_SQStream = pp_Var2;
    v_local = (HSQUIRRELVM)0x0;
  }
  return (SQRESULT)v_local;
}

Assistant:

SQRESULT sqstd_getfile(HSQUIRRELVM v, SQInteger idx, SQFILE *file)
{
    SQFile *fileobj = NULL;
    if(SQ_SUCCEEDED(sq_getinstanceup(v,idx,(SQUserPointer*)&fileobj,(SQUserPointer)SQSTD_FILE_TYPE_TAG))) {
        *file = fileobj->GetHandle();
        return SQ_OK;
    }
    return sq_throwerror(v,_SC("not a file"));
}